

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddDefinition(void *arg,char *name,char *value)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  cmMakefile::AddDefinition((cmMakefile *)arg,&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void CCONV cmAddDefinition(void* arg, const char* name, const char* value)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->AddDefinition(name, value);
}